

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_subcapture.c
# Opt level: O0

int main(int argc,char **args)

{
  light_pcapng p_Var1;
  char *pcVar2;
  uint32_t *__ptr;
  FILE *__s;
  long in_RSI;
  int in_EDI;
  char *offset;
  char *file_name;
  char subcapture_name [4096];
  FILE *subcapture_file;
  size_t subcapture_size;
  uint32_t *subcapture_mem;
  light_pcapng subcapture;
  light_pcapng pcapng;
  char *file;
  light_option option;
  char comment [73];
  int i;
  char *local_10b0;
  light_pcapng *in_stack_ffffffffffffef58;
  undefined4 in_stack_ffffffffffffef60;
  uint16_t in_stack_ffffffffffffef64;
  uint16_t in_stack_ffffffffffffef66;
  light_pcapng in_stack_ffffffffffffef68;
  light_boolean in_stack_ffffffffffffef84;
  light_option in_stack_ffffffffffffef88;
  light_pcapng in_stack_ffffffffffffef90;
  light_pcapng in_stack_ffffffffffffef98;
  size_t *in_stack_ffffffffffffefa0;
  light_pcapng in_stack_ffffffffffffefa8;
  size_t local_98;
  char local_68 [84];
  int local_14;
  long local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memcpy(local_68,"This pcapng file was created using LightPcapNg subcapture functionality.",0x49);
  strlen(local_68);
  light_create_option(in_stack_ffffffffffffef66,in_stack_ffffffffffffef64,in_stack_ffffffffffffef58)
  ;
  for (local_14 = 1; local_14 < local_8; local_14 = local_14 + 1) {
    local_10b0 = *(char **)(local_10 + (long)local_14 * 8);
    p_Var1 = light_read_from_path((char *)in_stack_ffffffffffffef68);
    if (p_Var1 == (light_pcapng)0x0) {
      fprintf(_stderr,"Unable to read pcapng: %s\n",local_10b0);
    }
    else {
      memset(&stack0xffffffffffffef58,0,0x1000);
      while( true ) {
        pcVar2 = strstr(local_10b0,"/");
        if (pcVar2 == (char *)0x0) break;
        local_10b0 = pcVar2 + 1;
      }
      light_subcapture(in_stack_ffffffffffffef68,
                       (_func_light_boolean_light_pcapng *)
                       CONCAT26(in_stack_ffffffffffffef66,
                                CONCAT24(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60)),
                       in_stack_ffffffffffffef58);
      light_add_option(in_stack_ffffffffffffef98,in_stack_ffffffffffffef90,in_stack_ffffffffffffef88
                       ,in_stack_ffffffffffffef84);
      __ptr = light_pcapng_to_memory(in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0);
      sprintf(&stack0xffffffffffffef58,"subcapture_%s",local_10b0);
      printf("Write subcapture to %s\n",&stack0xffffffffffffef58);
      __s = fopen(&stack0xffffffffffffef58,"wb");
      fwrite(__ptr,1,local_98,__s);
      fclose(__s);
      free(__ptr);
      light_pcapng_release
                ((light_pcapng)
                 CONCAT26(in_stack_ffffffffffffef66,
                          CONCAT24(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60)));
      light_pcapng_release
                ((light_pcapng)
                 CONCAT26(in_stack_ffffffffffffef66,
                          CONCAT24(in_stack_ffffffffffffef64,in_stack_ffffffffffffef60)));
    }
  }
  light_free_option((light_option)0x1024b3);
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;
	char comment[] = "This pcapng file was created using LightPcapNg subcapture functionality.";
	light_option option = light_create_option(0xB00B, strlen(comment), comment);

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng pcapng = light_read_from_path(file);
		if (pcapng != NULL) {
			light_pcapng subcapture = NULL;
			uint32_t *subcapture_mem;
			size_t subcapture_size;
			FILE *subcapture_file;
			char subcapture_name[PATH_MAX] = {0,};
			const char *file_name = file;
			char *offset;

			while ((offset = strstr(file_name, "/")) != NULL)
				file_name = offset + 1;

			light_subcapture(pcapng, subcapture_predicate, &subcapture);
			light_add_option(subcapture, subcapture, option, LIGHT_TRUE);
			subcapture_mem = light_pcapng_to_memory(subcapture, &subcapture_size);

			sprintf(subcapture_name, "subcapture_%s", file_name);
			printf("Write subcapture to %s\n", subcapture_name);
			subcapture_file = fopen(subcapture_name, "wb");
			fwrite(subcapture_mem, 1, subcapture_size, subcapture_file);
			fclose(subcapture_file);

			free(subcapture_mem);
			light_pcapng_release(subcapture);
			light_pcapng_release(pcapng);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	light_free_option(option);
	return 0;
}